

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::ReadListFile(cmMakefile *this,cmListFile *listFile,string *filenametoread)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  const_reference lff;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  cmExecutionStatus local_1cc;
  ulong uStack_1c8;
  cmExecutionStatus status;
  size_t i;
  size_t numberFunctions;
  LexicalPushPop lexScope;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_ba;
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string currentFile;
  allocator local_61;
  string local_60;
  string local_40 [8];
  string currentParentFile;
  string *filenametoread_local;
  cmListFile *listFile_local;
  cmMakefile *this_local;
  
  currentParentFile.field_2._8_8_ = filenametoread;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,filenametoread);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"CMAKE_PARENT_LIST_FILE",&local_61);
  pcVar2 = GetSafeDefinition(this,&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,pcVar2,(allocator *)(currentFile.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(currentFile.field_2._M_local_buf + 0xb));
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"CMAKE_CURRENT_LIST_FILE",&local_b9);
  pcVar2 = GetSafeDefinition(this,&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_98,pcVar2,&local_ba);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"CMAKE_CURRENT_LIST_FILE",&local_e1);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  AddDefinition(this,&local_e0,pcVar2);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"CMAKE_CURRENT_LIST_DIR",&local_109);
  cmsys::SystemTools::GetFilenamePath(&local_130,(string *)currentParentFile.field_2._8_8_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  AddDefinition(this,&local_108,pcVar2);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"CMAKE_PARENT_LIST_FILE",&local_151);
  MarkVariableAsUsed(this,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"CMAKE_CURRENT_LIST_FILE",&local_179);
  MarkVariableAsUsed(this,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a0,"CMAKE_CURRENT_LIST_DIR",(allocator *)&lexScope.field_0xf);
  MarkVariableAsUsed(this,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&lexScope.field_0xf);
  LexicalPushPop::LexicalPushPop((LexicalPushPop *)&numberFunctions,this);
  sVar3 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                    (&listFile->Functions);
  uStack_1c8 = 0;
  do {
    if (sVar3 <= uStack_1c8) {
LAB_00672cd7:
      CheckForUnusedVariables(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f0,"CMAKE_PARENT_LIST_FILE",&local_1f1);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      AddDefinition(this,&local_1f0,pcVar2);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_218,"CMAKE_CURRENT_LIST_FILE",&local_219);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      AddDefinition(this,&local_218,pcVar2);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_240,"CMAKE_CURRENT_LIST_DIR",&local_241);
      cmsys::SystemTools::GetFilenamePath(&local_268,(string *)local_98);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      AddDefinition(this,&local_240,pcVar2);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_288,"CMAKE_PARENT_LIST_FILE",&local_289);
      MarkVariableAsUsed(this,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2b0,"CMAKE_CURRENT_LIST_FILE",&local_2b1);
      MarkVariableAsUsed(this,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2d8,"CMAKE_CURRENT_LIST_DIR",&local_2d9);
      MarkVariableAsUsed(this,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      LexicalPushPop::~LexicalPushPop((LexicalPushPop *)&numberFunctions);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string(local_40);
      return;
    }
    cmExecutionStatus::cmExecutionStatus(&local_1cc);
    lff = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                    (&listFile->Functions,uStack_1c8);
    ExecuteCommand(this,lff,&local_1cc);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (bVar1) {
      LexicalPushPop::Quiet((LexicalPushPop *)&numberFunctions);
      goto LAB_00672cd7;
    }
    bVar1 = cmExecutionStatus::GetReturnInvoked(&local_1cc);
    if (bVar1) goto LAB_00672cd7;
    uStack_1c8 = uStack_1c8 + 1;
  } while( true );
}

Assistant:

void cmMakefile::ReadListFile(cmListFile const& listFile,
                              std::string const& filenametoread)
{
  // add this list file to the list of dependencies
  this->ListFiles.push_back(filenametoread);

  std::string currentParentFile
      = this->GetSafeDefinition("CMAKE_PARENT_LIST_FILE");
  std::string currentFile
    = this->GetSafeDefinition("CMAKE_CURRENT_LIST_FILE");

  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", filenametoread.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                       cmSystemTools::GetFilenamePath(filenametoread).c_str());

  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");

  // Enforce balanced blocks (if/endif, function/endfunction, etc.).
  LexicalPushPop lexScope(this);

  // Run the parsed commands.
  const size_t numberFunctions = listFile.Functions.size();
  for(size_t i =0; i < numberFunctions; ++i)
    {
    cmExecutionStatus status;
    this->ExecuteCommand(listFile.Functions[i],status);
    if(cmSystemTools::GetFatalErrorOccured())
      {
      // Exit early due to error.
      lexScope.Quiet();
      break;
      }
    if(status.GetReturnInvoked())
      {
      // Exit early due to return command.
      break;
      }
    }
  this->CheckForUnusedVariables();

  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentParentFile.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", currentFile.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(currentFile).c_str());
  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");
}